

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

void __thiscall FIX::ScreenLog::ScreenLog(ScreenLog *this,bool incoming,bool outgoing,bool event)

{
  undefined8 local_40;
  int64_t iStack_38;
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_001ee3a0;
  (this->m_prefix)._M_dataplus._M_p = (pointer)&(this->m_prefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_prefix,"GLOBAL","");
  DateTime::nowUtc();
  (this->m_time).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001ed778;
  *(undefined8 *)&(this->m_time).super_DateTime.m_date = local_40;
  (this->m_time).super_DateTime.m_time = iStack_38;
  (this->m_time).super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001ed798;
  this->m_incoming = incoming;
  this->m_outgoing = outgoing;
  this->m_event = event;
  return;
}

Assistant:

ScreenLog( bool incoming, bool outgoing, bool event )
: m_prefix( "GLOBAL" ),
  m_incoming( incoming ), m_outgoing( outgoing ), m_event( event ) {}